

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::CFLSubAvgTest_SubAvgTest_Test::~CFLSubAvgTest_SubAvgTest_Test
          (CFLSubAvgTest_SubAvgTest_Test *this)

{
  CFLSubAvgTest_SubAvgTest_Test *in_stack_00000010;
  
  anon_unknown.dwarf_15b07f::CFLSubAvgTest_SubAvgTest_Test::~CFLSubAvgTest_SubAvgTest_Test
            (in_stack_00000010);
  return;
}

Assistant:

TEST_P(CFLSubAvgTest, SubAvgTest) {
  int16_t dst[CFL_BUF_SQUARE];
  int16_t dst_ref[CFL_BUF_SQUARE];
  for (int it = 0; it < NUM_ITERATIONS; it++) {
    randData(&ACMRandom::Rand15);
    sub_avg(data, dst);
    sub_avg_ref(data_ref, dst_ref);
    assert_eq<int16_t>(dst, dst_ref, width, height);
  }
}